

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::initFactorMatrix
          (CLUFactor<double> *this,SVectorBase<double> **vec,double eps)

{
  U *pUVar1;
  Col *pCVar2;
  Dring *pDVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Dring *pDVar9;
  Dring *pDVar10;
  SVectorBase<double> *pSVar11;
  int *piVar12;
  pointer pdVar13;
  int *piVar14;
  bool bVar15;
  Dring *pDVar16;
  Nonzero<double> *pNVar17;
  int *piVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  Nonzero<double> *pNVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  long lVar27;
  Dring *pDVar28;
  byte bVar29;
  long lVar30;
  Dring *pDVar31;
  double dVar32;
  double dVar33;
  
  piVar6 = (this->temp).s_mark;
  if (0 < this->thedim) {
    piVar7 = (this->u).row.len;
    piVar8 = (this->u).row.max;
    lVar21 = 0;
    do {
      piVar7[lVar21] = 0;
      piVar8[lVar21] = 0;
      lVar21 = lVar21 + 1;
    } while (lVar21 < this->thedim);
  }
  bVar26 = 0 < this->thedim;
  if (this->thedim < 1) {
    dVar32 = 0.0;
  }
  else {
    piVar7 = (this->u).row.max;
    lVar21 = 0;
    iVar23 = 0;
    do {
      iVar20 = vec[lVar21]->memused;
      if ((long)iVar20 < 2) {
        bVar15 = true;
        if (iVar20 == 0) {
          this->stat = SINGULAR;
          bVar15 = false;
        }
      }
      else {
        pNVar22 = vec[lVar21]->m_elem;
        lVar27 = 0;
        do {
          piVar8 = piVar7 + *(int *)((long)&pNVar22->idx + lVar27);
          *piVar8 = *piVar8 + 1;
          lVar27 = lVar27 + 0x10;
        } while ((long)iVar20 << 4 != lVar27);
        iVar23 = iVar20 + iVar23;
        bVar15 = true;
      }
      if (!bVar15) break;
      lVar21 = lVar21 + 1;
      bVar26 = lVar21 < this->thedim;
    } while (lVar21 < this->thedim);
    dVar32 = (double)iVar23;
  }
  if (!bVar26) {
    minRowMem(this,(int)(this->rowMemMult * dVar32));
    iVar23 = (int)(this->colMemMult * dVar32);
    if ((this->u).col.size < iVar23) {
      (this->u).col.size = iVar23;
      spx_realloc<int*>(&(this->u).col.idx,iVar23);
    }
    minLMem(this,(int)(dVar32 * this->lMemMult));
    pUVar1 = &this->u;
    piVar7 = (this->u).row.start;
    *piVar7 = 0;
    pDVar9 = (this->u).row.elem;
    iVar23 = this->thedim;
    (this->u).row.list.idx = iVar23;
    (this->u).row.list.next = pDVar9;
    pCVar2 = &(this->u).col;
    pDVar10 = (this->u).col.elem;
    (this->u).col.list.idx = iVar23;
    (this->u).col.list.next = pDVar10;
    iVar20 = 0;
    iVar24 = 0;
    pDVar16 = &pCVar2->list;
    pDVar28 = (Dring *)pUVar1;
    if (0 < iVar23) {
      piVar8 = (this->u).row.max;
      lVar27 = 0;
      iVar24 = 0;
      pDVar16 = (Dring *)pUVar1;
      lVar21 = 0;
      pDVar28 = &pCVar2->list;
      pDVar31 = pDVar10;
      do {
        lVar30 = lVar21;
        pDVar3 = (Dring *)((long)&pDVar9->next + lVar30);
        piVar7[lVar27] = iVar24;
        iVar24 = iVar24 + piVar8[lVar27];
        *(int *)((long)&pDVar9->idx + lVar30) = (int)lVar27;
        *(Dring **)((long)&pDVar9->prev + lVar30) = pDVar16;
        (((Row *)&pDVar16->next)->list).next = pDVar3;
        *(int *)((long)&pDVar10->idx + lVar30) = (int)lVar27;
        *(Dring **)((long)&pDVar10->prev + lVar30) = pDVar28;
        ((Dring *)&pDVar28->next)->next = (Dring *)((long)&((Dring *)&pDVar10->next)->next + lVar30)
        ;
        lVar27 = lVar27 + 1;
        iVar23 = this->thedim;
        pDVar16 = pDVar3;
        lVar21 = lVar30 + 0x18;
        pDVar28 = pDVar31;
        pDVar31 = pDVar31 + 1;
      } while (lVar27 < iVar23);
      pDVar28 = (Dring *)((long)&pDVar9->next + lVar30);
      pDVar16 = (Dring *)((long)&((Dring *)&pDVar10->next)->next + lVar30);
    }
    piVar7[iVar23] = 0;
    (this->u).row.max[this->thedim] = 0;
    (this->u).row.used = iVar24;
    (((Row *)&pDVar28->next)->list).next = (Dring *)pUVar1;
    (this->u).row.list.prev = pDVar28;
    ((Dring *)&pDVar16->next)->next = &pCVar2->list;
    (this->u).col.list.prev = pDVar16;
    (this->temp).stage = 0;
    this->initMaxabs = 0.0;
    bVar26 = 0 < this->thedim;
    if (0 < this->thedim) {
      lVar21 = 0;
      iVar20 = 0;
      do {
        pSVar11 = vec[lVar21];
        (this->u).col.start[lVar21] = iVar20;
        uVar19 = 0;
        if (0 < (long)pSVar11->memused) {
          pNVar22 = pSVar11->m_elem;
          uVar19 = 0;
          uVar25 = 1;
          do {
            uVar19 = (eps < ABS(pNVar22->val)) + uVar19;
            if ((ulong)(long)pSVar11->memused <= uVar25) break;
            pNVar22 = pNVar22 + 1;
            uVar25 = uVar25 + 1;
          } while (uVar19 < 2);
        }
        if (uVar19 == 0) {
          this->stat = SINGULAR;
          bVar29 = 0;
        }
        else {
          iVar23 = (int)lVar21;
          if (uVar19 == 1) {
            pNVar22 = pSVar11->m_elem;
            do {
              pNVar17 = pNVar22;
              dVar32 = pNVar17->val;
              dVar33 = ABS(dVar32);
              pNVar22 = pNVar17 + 1;
            } while (dVar33 <= eps);
            iVar24 = pNVar17->idx;
            iVar5 = (this->row).perm[iVar24];
            bVar29 = (byte)((uint)iVar5 >> 0x1f);
            if (iVar5 < 0) {
              if (this->initMaxabs <= dVar33 && dVar33 != this->initMaxabs) {
                this->initMaxabs = dVar33;
              }
              setPivot(this,(this->temp).stage,iVar23,iVar24,dVar32);
              piVar6[(this->temp).stage] = iVar23;
              piVar7 = &(this->temp).stage;
              *piVar7 = *piVar7 + 1;
              (this->u).col.max[lVar21] = 0;
              (this->u).col.len[lVar21] = 0;
              (this->temp).s_cact[lVar21] = 0;
            }
            else {
              this->stat = SINGULAR;
            }
          }
          else {
            if (pSVar11->memused < 1) {
              iVar24 = 0;
            }
            else {
              piVar7 = (this->u).col.idx;
              piVar8 = (this->u).row.start;
              piVar12 = (this->u).row.len;
              pdVar13 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              piVar14 = (this->u).row.idx;
              piVar18 = &pSVar11->m_elem->idx;
              lVar27 = 0;
              iVar24 = 0;
              do {
                dVar32 = ((Nonzero<double> *)(piVar18 + -2))->val;
                dVar33 = ABS(dVar32);
                if (eps < dVar33) {
                  iVar5 = *piVar18;
                  piVar7[iVar20] = iVar5;
                  lVar30 = (long)piVar12[iVar5] + (long)piVar8[iVar5];
                  piVar14[lVar30] = iVar23;
                  pdVar13[lVar30] = dVar32;
                  piVar4 = piVar12 + iVar5;
                  *piVar4 = *piVar4 + 1;
                  if (this->initMaxabs <= dVar33 && dVar33 != this->initMaxabs) {
                    this->initMaxabs = dVar33;
                  }
                  iVar20 = iVar20 + 1;
                  iVar24 = iVar24 + 1;
                }
                lVar27 = lVar27 + 1;
                piVar18 = piVar18 + 4;
              } while (lVar27 < pSVar11->memused);
            }
            (this->u).col.max[lVar21] = iVar24;
            (this->u).col.len[lVar21] = iVar24;
            (this->temp).s_cact[lVar21] = iVar24;
            bVar29 = 1;
          }
        }
        if (bVar29 == 0) break;
        lVar21 = lVar21 + 1;
        bVar26 = lVar21 < this->thedim;
      } while (lVar21 < this->thedim);
    }
    if (!bVar26) {
      (this->u).col.used = iVar20;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}